

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O1

BBox3fa * __thiscall
embree::avx512::PointsISA::vbounds
          (BBox3fa *__return_storage_ptr__,PointsISA *this,LinearSpace3fa *space,size_t i)

{
  undefined4 uVar1;
  float fVar2;
  long lVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  lVar3 = *(long *)&(this->super_Points).super_Geometry.field_0x58;
  lVar5 = i * *(long *)&(this->super_Points).field_0x68;
  uVar1 = *(undefined4 *)(lVar3 + lVar5);
  auVar6._4_4_ = uVar1;
  auVar6._0_4_ = uVar1;
  auVar6._8_4_ = uVar1;
  auVar6._12_4_ = uVar1;
  uVar1 = *(undefined4 *)(lVar3 + 4 + lVar5);
  auVar9._4_4_ = uVar1;
  auVar9._0_4_ = uVar1;
  auVar9._8_4_ = uVar1;
  auVar9._12_4_ = uVar1;
  fVar2 = *(float *)(lVar3 + 8 + lVar5);
  auVar10._0_4_ = fVar2 * (space->vz).field_0.m128[0];
  auVar10._4_4_ = fVar2 * (space->vz).field_0.m128[1];
  auVar10._8_4_ = fVar2 * (space->vz).field_0.m128[2];
  auVar10._12_4_ = fVar2 * (space->vz).field_0.m128[3];
  auVar9 = vfmadd231ps_fma(auVar10,auVar9,(undefined1  [16])(space->vy).field_0);
  auVar9 = vfmadd231ps_fma(auVar9,auVar6,(undefined1  [16])(space->vx).field_0);
  fVar2 = *(float *)(lVar3 + 0xc + lVar5);
  auVar7._4_4_ = fVar2;
  auVar7._0_4_ = fVar2;
  auVar7._8_4_ = fVar2;
  auVar7._12_4_ = fVar2;
  auVar9 = vblendps_avx(auVar9,auVar7,8);
  fVar2 = fVar2 * (this->super_Points).maxRadiusScale;
  auVar8._4_4_ = fVar2;
  auVar8._0_4_ = fVar2;
  auVar8._8_4_ = fVar2;
  auVar8._12_4_ = fVar2;
  aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar9,auVar8);
  (__return_storage_ptr__->lower).field_0 = aVar4;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar9._0_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar9._4_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar9._8_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar9._12_4_ + fVar2;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const
      {
        return bounds(space, i);
      }